

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::LoopLayerParams::ByteSizeLong(LoopLayerParams *this)

{
  bool bVar1;
  int size;
  ulong uVar2;
  string *value;
  uint64_t uVar3;
  size_t sVar4;
  long lVar5;
  int cached_size;
  uint32_t cached_has_bits;
  size_t total_size;
  LoopLayerParams *this_local;
  
  _cached_size = 0;
  _internal_conditionvar_abi_cxx11_(this);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    value = _internal_conditionvar_abi_cxx11_(this);
    _cached_size = google::protobuf::internal::WireFormatLite::StringSize(value);
    _cached_size = _cached_size + 1;
  }
  bVar1 = _internal_has_conditionnetwork(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::NeuralNetwork>(this->conditionnetwork_);
    _cached_size = sVar4 + 1 + _cached_size;
  }
  bVar1 = _internal_has_bodynetwork(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::NeuralNetwork>(this->bodynetwork_);
    _cached_size = sVar4 + 1 + _cached_size;
  }
  uVar3 = _internal_maxloopiterations(this);
  if (uVar3 != 0) {
    uVar3 = _internal_maxloopiterations(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64SizePlusOne(uVar3);
    _cached_size = sVar4 + _cached_size;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar5 = std::__cxx11::string::size();
    _cached_size = lVar5 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t LoopLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LoopLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // string conditionVar = 2;
  if (!this->_internal_conditionvar().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_conditionvar());
  }

  // .CoreML.Specification.NeuralNetwork conditionNetwork = 3;
  if (this->_internal_has_conditionnetwork()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *conditionnetwork_);
  }

  // .CoreML.Specification.NeuralNetwork bodyNetwork = 4;
  if (this->_internal_has_bodynetwork()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *bodynetwork_);
  }

  // uint64 maxLoopIterations = 1;
  if (this->_internal_maxloopiterations() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_maxloopiterations());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}